

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O3

void __thiscall YBBVirtualMachine::run(YBBVirtualMachine *this)

{
  uint *__k;
  char *pcVar1;
  int iVar2;
  uint uVar3;
  ulong uVar5;
  mapped_type *pmVar6;
  pointer pYVar7;
  mapped_type mVar4;
  
  std::vector<signed_char,_std::allocator<signed_char>_>::reserve(&this->registers,0x2000);
  uVar5 = (ulong)this->instrPos;
  pYVar7 = (this->instructions).super__Vector_base<YBBInst,_std::allocator<YBBInst>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (uVar5 < (ulong)((long)(this->instructions).
                            super__Vector_base<YBBInst,_std::allocator<YBBInst>_>._M_impl.
                            super__Vector_impl_data._M_finish - (long)pYVar7)) {
    __k = &this->instrPos;
    do {
      switch(pYVar7[uVar5]) {
      case JmpNext:
        if ((this->registers).super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
            super__Vector_impl_data._M_start[this->ptrPos & 0x1fff] != '\0') break;
        pmVar6 = std::
                 map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                 ::operator[](&this->jmpMap,__k);
        mVar4 = *pmVar6;
        goto LAB_0010296c;
      case PtrRMov:
        this->ptrPos = this->ptrPos + 1;
        break;
      case PtrAdd:
        pcVar1 = (this->registers).super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                 _M_impl.super__Vector_impl_data._M_start + (this->ptrPos & 0x1fff);
        *pcVar1 = *pcVar1 + '\x01';
        break;
      case PtrPrint:
        putchar((int)(this->registers).super__Vector_base<signed_char,_std::allocator<signed_char>_>
                     ._M_impl.super__Vector_impl_data._M_start[this->ptrPos & 0x1fff]);
        break;
      case PtrInput:
        iVar2 = getchar();
        (this->registers).super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
        super__Vector_impl_data._M_start[this->ptrPos & 0x1fff] = (char)iVar2;
        break;
      case PtrSub:
        pcVar1 = (this->registers).super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                 _M_impl.super__Vector_impl_data._M_start + (this->ptrPos & 0x1fff);
        *pcVar1 = *pcVar1 + -1;
        break;
      case PtrLMov:
        this->ptrPos = this->ptrPos - 1;
        break;
      case JmpFirst:
        pmVar6 = std::
                 map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                 ::operator[](&this->jmpMap,__k);
        uVar3 = *pmVar6;
        goto LAB_0010296e;
      }
      mVar4 = *__k;
LAB_0010296c:
      uVar3 = mVar4 + 1;
LAB_0010296e:
      this->instrPos = uVar3;
      uVar5 = (ulong)uVar3;
      pYVar7 = (this->instructions).super__Vector_base<YBBInst,_std::allocator<YBBInst>_>._M_impl.
               super__Vector_impl_data._M_start;
    } while (uVar5 < (ulong)((long)(this->instructions).
                                   super__Vector_base<YBBInst,_std::allocator<YBBInst>_>._M_impl.
                                   super__Vector_impl_data._M_finish - (long)pYVar7));
  }
  return;
}

Assistant:

void run(){
        //
        registers.reserve(STACK_SIZE);
        while (instrPos < instructions.size()){
            switch (instructions[instrPos]) {
                case PtrRMov:
                    ptrPos++;
                    break;
                case PtrLMov:
                    ptrPos--;
                    break;
                case PtrAdd:
                    registers[ptrPos & (STACK_SIZE - 1)] += 1;
                    break;
                case PtrSub:
                    registers[ptrPos & (STACK_SIZE - 1)] -= 1;
                    break;
                case PtrPrint:
                    putchar(registers[ptrPos & (STACK_SIZE - 1)]);
                    break;
                case PtrInput:
                    registers[ptrPos & (STACK_SIZE - 1)] = getchar();
                    break;
                case JmpNext:
                    if (registers[ptrPos & (STACK_SIZE - 1)] == 0) {
                        instrPos = jmpMap[instrPos] + 1;
                        continue;
                    }
                    break;
                case JmpFirst:
                    instrPos = jmpMap[instrPos];
                    continue;
            }
            instrPos++;
        }
    }